

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

void bcread_fill(LexState *ls,MSize len,int need)

{
  SBuf *sb;
  uint uVar1;
  MSize sz_00;
  char *__src;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  size_t sz;
  ulong local_38;
  
  if ((len < 0x7fffff01) && (-1 < ls->c)) {
    sb = &ls->sb;
    __src = ls->p;
    pcVar2 = ls->pe;
    while( true ) {
      uVar4 = (ls->sb).b.ptr32;
      pcVar3 = (char *)(ulong)uVar4;
      uVar6 = (long)pcVar2 - (long)__src;
      iVar5 = (int)uVar6;
      if (iVar5 == 0) {
        uVar6 = 0;
      }
      else {
        if ((sb->p).ptr32 == uVar4) {
          if ((ls->sb).e.ptr32 - uVar4 < len) {
            pcVar3 = lj_buf_need2(sb,len);
            __src = ls->p;
          }
          memcpy(pcVar3,__src,uVar6 & 0xffffffff);
        }
        else if (__src != pcVar3) {
          memmove(pcVar3,__src,uVar6 & 0xffffffff);
        }
        uVar6 = uVar6 & 0xffffffff;
        ls->p = pcVar3;
        ls->pe = pcVar3 + uVar6;
      }
      (ls->sb).p.ptr32 = (int)pcVar3 + (int)uVar6;
      __src = (*ls->rfunc)(ls->L,ls->rdata,&local_38);
      if ((__src == (char *)0x0) || (local_38 == 0)) break;
      if (0x7fffff00 - iVar5 <= local_38) {
        lj_err_mem(ls->L);
      }
      if (iVar5 == 0) {
        ls->p = __src;
        pcVar2 = __src + local_38;
      }
      else {
        uVar4 = (int)local_38 + iVar5;
        sz_00 = len;
        if (len < uVar4) {
          sz_00 = uVar4;
        }
        uVar1 = (ls->sb).b.ptr32;
        pcVar3 = (char *)(ulong)uVar1;
        if ((ls->sb).e.ptr32 - uVar1 < sz_00) {
          pcVar3 = lj_buf_need2(sb,sz_00);
        }
        memcpy((void *)(ulong)(ls->sb).p.ptr32,__src,local_38);
        pcVar2 = pcVar3 + uVar4;
        (ls->sb).p.ptr32 = (uint32_t)pcVar2;
        ls->p = pcVar3;
        __src = pcVar3;
      }
      ls->pe = pcVar2;
      if (len <= (uint)((int)pcVar2 - (int)__src)) {
        return;
      }
    }
    if (need == 0) {
      ls->c = -1;
      return;
    }
  }
  bcread_error((LexState *)ls->L,(ErrMsg)ls->chunkarg);
}

Assistant:

static LJ_NOINLINE void bcread_fill(LexState *ls, MSize len, int need)
{
  lj_assertLS(len != 0, "empty refill");
  if (len > LJ_MAX_BUF || ls->c < 0)
    bcread_error(ls, LJ_ERR_BCBAD);
  do {
    const char *buf;
    size_t sz;
    char *p = sbufB(&ls->sb);
    MSize n = (MSize)(ls->pe - ls->p);
    if (n) {  /* Copy remainder to buffer. */
      if (sbuflen(&ls->sb)) {  /* Move down in buffer. */
	lj_assertLS(ls->pe == sbufP(&ls->sb), "bad buffer pointer");
	if (ls->p != p) memmove(p, ls->p, n);
      } else {  /* Copy from buffer provided by reader. */
	p = lj_buf_need(&ls->sb, len);
	memcpy(p, ls->p, n);
      }
      ls->p = p;
      ls->pe = p + n;
    }
    setsbufP(&ls->sb, p + n);
    buf = ls->rfunc(ls->L, ls->rdata, &sz);  /* Get more data from reader. */
    if (buf == NULL || sz == 0) {  /* EOF? */
      if (need) bcread_error(ls, LJ_ERR_BCBAD);
      ls->c = -1;  /* Only bad if we get called again. */
      break;
    }
    if (sz >= LJ_MAX_BUF - n) lj_err_mem(ls->L);
    if (n) {  /* Append to buffer. */
      n += (MSize)sz;
      p = lj_buf_need(&ls->sb, n < len ? len : n);
      memcpy(sbufP(&ls->sb), buf, sz);
      setsbufP(&ls->sb, p + n);
      ls->p = p;
      ls->pe = p + n;
    } else {  /* Return buffer provided by reader. */
      ls->p = buf;
      ls->pe = buf + sz;
    }
  } while ((MSize)(ls->pe - ls->p) < len);
}